

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

bool __thiscall BenevolentBotStrategy::canFortify(BenevolentBotStrategy *this)

{
  Country *pCVar1;
  Country *pCVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar6;
  reference ppCVar7;
  Country *neighbour_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1_1;
  Country *neighbour;
  iterator __end4;
  iterator __begin4;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range4;
  Country *country;
  iterator __end1;
  iterator __begin1;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *__range1;
  Country *smallestCountry;
  bool canFortify;
  BenevolentBotStrategy *this_local;
  
  smallestCountry._7_1_ = false;
  __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0;
  pvVar6 = Player::getOwnedCountries((this->super_PlayerStrategy).player);
  __end1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
  country = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                     *)&country), bVar3) {
    ppCVar7 = __gnu_cxx::
              __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
              ::operator*(&__end1);
    pCVar2 = *ppCVar7;
    pCVar1 = pCVar2;
    if (__range1 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) {
      iVar4 = Map::Country::getNumberOfTroops((Country *)__range1);
      iVar5 = Map::Country::getNumberOfTroops(pCVar2);
      pCVar1 = (Country *)__range1;
      if (iVar5 < iVar4) {
        pvVar6 = Map::Country::getAdjCountries(pCVar2);
        __end4 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
        neighbour = (Country *)
                    std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6);
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                                           *)&neighbour), pCVar1 = (Country *)__range1, bVar3) {
          ppCVar7 = __gnu_cxx::
                    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                    ::operator*(&__end4);
          pCVar1 = *ppCVar7;
          iVar4 = Map::Country::getPlayerOwnerID(pCVar1);
          iVar5 = Map::Country::getPlayerOwnerID(pCVar2);
          if (iVar4 == iVar5) {
            iVar4 = Map::Country::getNumberOfTroops(pCVar1);
            iVar5 = Map::Country::getNumberOfTroops(pCVar2);
            if (iVar5 < iVar4) {
              smallestCountry._7_1_ = true;
              __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)pCVar2;
            }
          }
          __gnu_cxx::
          __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
          ::operator++(&__end4);
        }
      }
    }
    __range1 = (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)pCVar1;
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1);
  }
  pvVar6 = Map::Country::getAdjCountries((Country *)__range1);
  __end1_1 = std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::begin(pvVar6);
  neighbour_1 = (Country *)std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::end(pvVar6)
  ;
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
                             *)&neighbour_1), bVar3) {
    ppCVar7 = __gnu_cxx::
              __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
              ::operator*(&__end1_1);
    pCVar2 = *ppCVar7;
    iVar4 = Map::Country::getPlayerOwnerID(pCVar2);
    iVar5 = Map::Country::getPlayerOwnerID((Country *)__range1);
    if (iVar4 == iVar5) {
      iVar4 = Map::Country::getNumberOfTroops(pCVar2);
      iVar5 = Map::Country::getNumberOfTroops((Country *)__range1);
      if (iVar5 < iVar4) {
        smallestCountry._7_1_ = true;
      }
    }
    __gnu_cxx::
    __normal_iterator<Map::Country_**,_std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>_>
    ::operator++(&__end1_1);
  }
  return smallestCountry._7_1_;
}

Assistant:

bool BenevolentBotStrategy::canFortify() {
    bool canFortify = false;
    Map::Country* smallestCountry = nullptr;

    for (auto* country: *player->getOwnedCountries()) {
        if (smallestCountry == nullptr) {
            smallestCountry = country;
        } else if (smallestCountry->getNumberOfTroops() > country->getNumberOfTroops()) {
            for (auto* neighbour : *country->getAdjCountries()) {
                if (neighbour->getPlayerOwnerID() == country->getPlayerOwnerID()
                    && neighbour->getNumberOfTroops() > country->getNumberOfTroops()) {
                    smallestCountry = country;
                    canFortify = true;
                }
            }
        }
    }

    for (auto* neighbour : *smallestCountry->getAdjCountries()) {
        if (neighbour->getPlayerOwnerID() == smallestCountry->getPlayerOwnerID()
                && neighbour->getNumberOfTroops() > smallestCountry->getNumberOfTroops()) {
            canFortify = true;
        }
    }
    return canFortify;
}